

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O0

void __thiscall
glcts::TextureBufferTextureBufferRange::initTest(TextureBufferTextureBufferRange *this)

{
  pointer *this_00;
  allocator<unsigned_char> *this_01;
  uint uVar1;
  GLenum GVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  GLuint GVar7;
  NotSupportedError *this_02;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  size_type sVar9;
  reference pvVar10;
  mapped_type *pmVar11;
  reference pvVar12;
  pointer ppVar13;
  FormatInfo *info;
  _Self local_1b0;
  iterator it;
  GLuint offset;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  uint local_bc;
  value_type_conflict4 local_b8;
  GLuint i;
  value_type_conflict4 local_b0 [28];
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> formats;
  Functions *gl;
  TextureBufferTextureBufferRange *this_local;
  
  if (((this->super_TestCaseBase).m_is_texture_buffer_supported & 1U) == 0) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_02,"Texture buffer functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
               ,0x256);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar8 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar5 = (*pRVar8->_vptr_RenderContext[3])();
  formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar5);
  (**(code **)(formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x21a))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER_OFFSET_ALIGNMENT,
             &this->m_texture_buffer_offset_alignment);
  dVar6 = (**(code **)(formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar6,"Error getting GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT_EXT parameter value!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x25d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  local_b0[0x1b] = 0x8229;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 0x1b);
  local_b0[0x1a] = 0x822d;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 0x1a);
  local_b0[0x19] = 0x822e;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 0x19);
  local_b0[0x18] = 0x8231;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 0x18);
  local_b0[0x17] = 0x8233;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 0x17);
  local_b0[0x16] = 0x8235;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 0x16);
  local_b0[0x15] = 0x8232;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 0x15);
  local_b0[0x14] = 0x8234;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 0x14);
  local_b0[0x13] = 0x8236;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 0x13);
  local_b0[0x12] = 0x822b;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 0x12);
  local_b0[0x11] = 0x822f;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 0x11);
  local_b0[0x10] = 0x8230;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 0x10);
  local_b0[0xf] = 0x8237;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 0xf);
  local_b0[0xe] = 0x8239;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 0xe);
  local_b0[0xd] = 0x823b;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 0xd);
  local_b0[0xc] = 0x8238;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 0xc);
  local_b0[0xb] = 0x823a;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 0xb);
  local_b0[10] = 0x823c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 10);
  local_b0[9] = 0x8815;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 9);
  local_b0[8] = 0x8d83;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 8);
  local_b0[7] = 0x8d71;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 7);
  local_b0[6] = 0x8058;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 6);
  local_b0[5] = 0x881a;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 5);
  local_b0[4] = 0x8814;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 4);
  local_b0[3] = 0x8d8e;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 3);
  local_b0[2] = 0x8d88;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 2);
  local_b0[1] = 0x8d82;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0 + 1);
  local_b0[0] = 0x8d7c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,local_b0);
  i = 0x8d76;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,&i);
  local_b8 = 0x8d70;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,&local_b8);
  local_bc = 0;
  while( true ) {
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
    if (sVar9 <= local_bc) break;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                         (ulong)local_bc);
    FormatInfo::FormatInfo
              ((FormatInfo *)
               &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,*pvVar10,
               this->m_texture_buffer_offset_alignment);
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                         (ulong)local_bc);
    pmVar11 = std::
              map<unsigned_int,_glcts::FormatInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_glcts::FormatInfo>_>_>
              ::operator[](&this->m_configurations,pvVar10);
    this_00 = &buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    FormatInfo::operator=(pmVar11,(FormatInfo *)this_00);
    FormatInfo::~FormatInfo((FormatInfo *)this_00);
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                         (ulong)local_bc);
    pmVar11 = std::
              map<unsigned_int,_glcts::FormatInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_glcts::FormatInfo>_>_>
              ::operator[](&this->m_configurations,pvVar10);
    GVar7 = FormatInfo::get_aligned_size(pmVar11);
    this->m_buffer_total_size = GVar7 + this->m_buffer_total_size;
    local_bc = local_bc + 1;
  }
  uVar1 = this->m_buffer_total_size;
  this_01 = (allocator<unsigned_char> *)((long)&it._M_node + 7);
  std::allocator<unsigned_char>::allocator(this_01);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&offset,(ulong)uVar1,this_01);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&it._M_node + 7));
  pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&offset,0);
  memset(pvVar12,0,(ulong)this->m_buffer_total_size);
  it._M_node._0_4_ = 0;
  local_1b0._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_glcts::FormatInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_glcts::FormatInfo>_>_>
       ::begin(&this->m_configurations);
  while( true ) {
    info = (FormatInfo *)
           std::
           map<unsigned_int,_glcts::FormatInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_glcts::FormatInfo>_>_>
           ::end(&this->m_configurations);
    bVar4 = std::operator!=(&local_1b0,(_Self *)&info);
    if (!bVar4) break;
    ppVar13 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_glcts::FormatInfo>_>::operator->
                        (&local_1b0);
    pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&offset,0);
    fillInputData(this,pvVar12,(GLuint)it._M_node,&ppVar13->second);
    GVar7 = FormatInfo::get_aligned_size(&ppVar13->second);
    it._M_node._0_4_ = GVar7 + (GLuint)it._M_node;
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_glcts::FormatInfo>_>::operator++
              (&local_1b0);
  }
  (**(code **)(formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x1c2))(1,&this->m_vao_id);
  (**(code **)(formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x36))(this->m_vao_id);
  (**(code **)(formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x1b2))(1,&this->m_tbo_id);
  dVar6 = (**(code **)(formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar6,"Error generating buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x299);
  (**(code **)(formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x10))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,this->m_tbo_id);
  dVar6 = (**(code **)(formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar6,"Error binding buffer object !",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x29b);
  pcVar3 = *(code **)(formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0x54);
  GVar2 = (this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER;
  GVar7 = this->m_buffer_total_size;
  pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&offset,0);
  (*pcVar3)(GVar2,GVar7,pvVar12,0x88e4);
  dVar6 = (**(code **)(formats.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar6,"Error allocating buffer object\'s data store!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
                  ,0x29d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&offset);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  return;
}

Assistant:

void TextureBufferTextureBufferRange::initTest(void)
{
	/* Check if texture buffer extension is supported */
	if (!m_is_texture_buffer_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BUFFER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.getIntegerv(m_glExtTokens.TEXTURE_BUFFER_OFFSET_ALIGNMENT, &m_texture_buffer_offset_alignment);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT_EXT parameter value!");

	/* Create list of textures internal formats */
	std::vector<glw::GLenum> formats;

	formats.push_back(GL_R8);
	formats.push_back(GL_R16F);
	formats.push_back(GL_R32F);
	formats.push_back(GL_R8I);
	formats.push_back(GL_R16I);
	formats.push_back(GL_R32I);
	formats.push_back(GL_R8UI);
	formats.push_back(GL_R16UI);
	formats.push_back(GL_R32UI);
	formats.push_back(GL_RG8);
	formats.push_back(GL_RG16F);
	formats.push_back(GL_RG32F);
	formats.push_back(GL_RG8I);
	formats.push_back(GL_RG16I);
	formats.push_back(GL_RG32I);
	formats.push_back(GL_RG8UI);
	formats.push_back(GL_RG16UI);
	formats.push_back(GL_RG32UI);
	formats.push_back(GL_RGB32F);
	formats.push_back(GL_RGB32I);
	formats.push_back(GL_RGB32UI);
	formats.push_back(GL_RGBA8);
	formats.push_back(GL_RGBA16F);
	formats.push_back(GL_RGBA32F);
	formats.push_back(GL_RGBA8I);
	formats.push_back(GL_RGBA16I);
	formats.push_back(GL_RGBA32I);
	formats.push_back(GL_RGBA8UI);
	formats.push_back(GL_RGBA16UI);
	formats.push_back(GL_RGBA32UI);

	/* Create configuration for internal formats and add them to the map */
	for (glw::GLuint i = 0; i < formats.size(); ++i)
	{
		m_configurations[formats[i]] = FormatInfo(formats[i], m_texture_buffer_offset_alignment);
		m_buffer_total_size += m_configurations[formats[i]].get_aligned_size();
	}

	std::vector<glw::GLubyte> buffer(m_buffer_total_size);
	memset(&buffer[0], 0, m_buffer_total_size);

	glw::GLuint offset = 0;
	for (std::map<glw::GLenum, FormatInfo>::iterator it = m_configurations.begin(); it != m_configurations.end(); ++it)
	{
		FormatInfo& info = it->second;
		fillInputData(&buffer[0], offset, info);
		offset += info.get_aligned_size();
	}

	/* Set up a vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	/* Create buffer object */
	gl.genBuffers(1, &m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating buffer object!");
	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, m_tbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object !");
	gl.bufferData(m_glExtTokens.TEXTURE_BUFFER, m_buffer_total_size, &buffer[0], GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");
}